

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSoftBodyTriangleCallback::btSoftBodyTriangleCallback
          (btSoftBodyTriangleCallback *this,btDispatcher *dispatcher,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  btCollisionObjectWrapper *pbVar1;
  
  (this->super_btTriangleCallback)._vptr_btTriangleCallback =
       (_func_int **)&PTR__btSoftBodyTriangleCallback_001f28b0;
  this->m_dispatcher = dispatcher;
  this->m_dispatchInfoPtr = (btDispatcherInfo *)0x0;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex>::btHashMap(&this->m_shapeCache);
  pbVar1 = body1Wrap;
  if (isSwapped) {
    pbVar1 = body0Wrap;
    body0Wrap = body1Wrap;
  }
  this->m_softBody = (btSoftBody *)body0Wrap->m_collisionObject;
  this->m_triBody = pbVar1->m_collisionObject;
  clearCache(this);
  return;
}

Assistant:

btSoftBodyTriangleCallback::btSoftBodyTriangleCallback(btDispatcher*  dispatcher,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped):
m_dispatcher(dispatcher),
m_dispatchInfoPtr(0)
{
	m_softBody = (isSwapped? (btSoftBody*)body1Wrap->getCollisionObject():(btSoftBody*)body0Wrap->getCollisionObject());
	m_triBody = isSwapped? body0Wrap->getCollisionObject():body1Wrap->getCollisionObject();

	//
	// create the manifold from the dispatcher 'manifold pool'
	//
	//	  m_manifoldPtr = m_dispatcher->getNewManifold(m_convexBody,m_triBody);

	clearCache();
}